

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadNumericExpr(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this,char code,bool ignore_zero)

{
  int func_index;
  int iVar1;
  NumericExpr NVar2;
  ExprBase EVar3;
  Reference RVar4;
  NumericExpr NVar5;
  undefined7 in_register_00000031;
  long lVar6;
  double value;
  CallArgHandler CVar7;
  
  iVar1 = (int)CONCAT71(in_register_00000031,code);
  switch(iVar1) {
  case 0x6c:
  case 0x6e:
  case 0x73:
    value = ReadConstant(this,code);
    if (value != 0.0 || !ignore_zero) {
      NVar2 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnNumber
                        (this->handler_,value);
      return (NumericExpr)NVar2.super_ExprBase.impl_;
    }
    break;
  case 0x6f:
    iVar1 = ReadOpCode(this);
    NVar5 = ReadNumericExpr(this,iVar1);
    return (NumericExpr)NVar5.super_ExprBase.impl_;
  case 0x76:
    RVar4 = DoReadReference(this);
    return (NumericExpr)
           RVar4.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
  default:
    if (iVar1 == 0x66) {
      func_index = ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.
                                 num_funcs);
      iVar1 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      CVar7 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginCall
                        (this->handler_,func_index,iVar1);
      lVar6 = 0;
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      for (; iVar1 != (int)lVar6; lVar6 = lVar6 + 1) {
        EVar3.impl_ = (Impl *)ReadSymbolicExpr(this);
        ((ExprBase *)(&(CVar7.impl_)->super_Impl + (CVar7.arg_index_ + lVar6) * 2U + 6))->impl_ =
             EVar3.impl_;
      }
      return (NumericExpr)(ExprBase)&(CVar7.impl_)->super_Impl;
    }
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x75:
    TextReader<fmt::Locale>::ReportError<>(this->reader_,(CStringRef)0x15c1ef);
  }
  return (NumericExpr)(Impl *)0x0;
}

Assistant:

typename Handler::NumericExpr
    NLReader<Reader, Handler>::ReadNumericExpr(char code, bool ignore_zero) {
  switch (code) {
  case 'f': {
    // Read a function call.
    int func_index = ReadUInt(header_.num_funcs);
    int num_args = reader_.ReadUInt();
    reader_.ReadTillEndOfLine();
    typename Handler::CallArgHandler args =
        handler_.BeginCall(func_index, num_args);
    for (int i = 0; i < num_args; ++i)
      args.AddArg(ReadSymbolicExpr());
    return handler_.EndCall(args);
  }
  case 'n': case 'l': case 's': {
    // Read a number.
    double value = ReadConstant(code);
    if (ignore_zero && value == 0)
      break;  // Ignore zero constant.
    return handler_.OnNumber(value);
  }
  case 'o':
    return ReadNumericExpr(ReadOpCode());
  case 'v':
    return DoReadReference();
  default:
    reader_.ReportError("expected expression");
  }
  return NumericExpr();
}